

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping_unchecked
          (xcb_connection_t *c,uint8_t device_id,xcb_input_key_code_t first_keycode,uint8_t count)

{
  undefined1 in_CL;
  undefined1 in_DL;
  undefined1 in_SIL;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  xcb_input_get_device_key_mapping_request_t xcb_out;
  xcb_input_get_device_key_mapping_cookie_t xcb_ret;
  iovec xcb_parts [4];
  undefined8 local_58;
  uint local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_4c = 0xaaaaaaaa;
  local_58 = (ulong)CONCAT16(in_CL,CONCAT15(in_DL,CONCAT14(in_SIL,0xaaaaaaaa)));
  local_28 = &local_58;
  uStack_20 = 8;
  local_18 = 0;
  uStack_10 = 0;
  local_4c = xcb_send_request(in_RDI,0,&local_28,
                              &xcb_input_get_device_key_mapping_unchecked::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_input_get_device_key_mapping_cookie_t)local_4c;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping_unchecked (xcb_connection_t     *c,
                                            uint8_t               device_id,
                                            xcb_input_key_code_t  first_keycode,
                                            uint8_t               count)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 2,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_GET_DEVICE_KEY_MAPPING,
        .isvoid = 0
    };

    struct iovec xcb_parts[4];
    xcb_input_get_device_key_mapping_cookie_t xcb_ret;
    xcb_input_get_device_key_mapping_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.first_keycode = first_keycode;
    xcb_out.count = count;
    xcb_out.pad0 = 0;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, 0, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}